

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_90(QPDF *pdf,char *arg2)

{
  QPDFObjectHandle local_168;
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  QPDFObjectHandle local_c8;
  allocator<char> local_b1;
  string local_b0 [32];
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60 [2];
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *arg2_local;
  QPDF *pdf_local;
  
  local_18 = arg2;
  arg2_local = (char *)pdf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,arg2,&local_39);
  QPDF::updateFromJSON((string *)pdf);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  QPDF::getTrailer();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_60);
  QPDFObjectHandle::~QPDFObjectHandle(&local_70);
  QPDFObjectHandle::~QPDFObjectHandle(local_60);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"/QTest",&local_b1);
  QPDFObjectHandle::getKey((string *)&local_80);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_80);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_80);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"/QTest",&local_119);
  QPDFObjectHandle::getKey((string *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"/strings",&local_141);
  QPDFObjectHandle::getKey((string *)&local_d8);
  QPDFObjectHandle::getIntValue();
  QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  QPDF::getRoot();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_158);
  QPDFObjectHandle::~QPDFObjectHandle(&local_168);
  QPDFObjectHandle::~QPDFObjectHandle(&local_158);
  return;
}

Assistant:

static void
test_90(QPDF& pdf, char const* arg2)
{
    // Generate object warning with update-from-json. Crafted to work
    // with good13.pdf and various-updates.json. JSON file is arg2.
    pdf.updateFromJSON(arg2);
    pdf.getTrailer().appendItem(QPDFObjectHandle::newNull());
    pdf.getTrailer().getKey("/QTest").appendItem(QPDFObjectHandle::newNull());
    pdf.getTrailer().getKey("/QTest").getKey("/strings").getIntValue();
    // not from json
    pdf.getRoot().appendItem(QPDFObjectHandle::newNull());
}